

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void array_run_container_intersection
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  int iVar1;
  rle16_t *prVar2;
  uint16_t *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint16_t *puVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  
  iVar5 = src_2->n_runs;
  if (((iVar5 == 1) && (src_2->runs->value == 0)) && (src_2->runs->length == 0xffff)) {
    if (dst != src_1) {
      array_container_copy(src_1,dst);
      return;
    }
  }
  else {
    if (dst->capacity < src_1->cardinality) {
      array_container_grow(dst,src_1->cardinality,false);
      iVar5 = src_2->n_runs;
    }
    if (iVar5 != 0) {
      iVar1 = src_1->cardinality;
      if (iVar1 < 1) {
        iVar7 = 0;
      }
      else {
        prVar2 = src_2->runs;
        uVar10 = (uint)prVar2->value;
        uVar11 = (uint)prVar2->length;
        puVar3 = src_1->array;
        iVar8 = 0;
        iVar7 = 0;
        uVar16 = 0;
        do {
          uVar15 = puVar3[(int)uVar16];
          if (uVar11 + uVar10 < (uint)uVar15) {
            puVar14 = &prVar2[(long)iVar8 + 1].length;
            do {
              if (iVar5 + -1 == iVar8) goto LAB_00114aff;
              uVar10 = (uint)((rle16_t *)(puVar14 + -1))->value;
              uVar11 = (uint)*puVar14;
              puVar14 = puVar14 + 2;
              iVar8 = iVar8 + 1;
            } while (uVar10 + uVar11 < (uint)uVar15);
          }
          uVar9 = (ushort)uVar10;
          if (uVar15 < uVar9) {
            uVar13 = uVar16 + 1;
            uVar17 = uVar13;
            if (((int)uVar13 < iVar1) && (puVar3[(int)uVar13] < uVar9)) {
              uVar16 = uVar16 + 2;
              iVar6 = 1;
              if ((int)uVar16 < iVar1) {
                iVar12 = 1;
                do {
                  uVar15 = puVar3[(int)uVar16];
                  iVar6 = iVar12;
                  if (uVar9 <= uVar15) goto LAB_00114a9b;
                  iVar6 = iVar12 * 2;
                  uVar16 = uVar13 + iVar12 * 2;
                  iVar12 = iVar6;
                } while ((int)uVar16 < iVar1);
              }
              uVar15 = puVar3[iVar1 - 1U];
              uVar16 = iVar1 - 1U;
LAB_00114a9b:
              uVar17 = uVar16;
              if (uVar15 != uVar9) {
                if (uVar15 < uVar9) break;
                if ((iVar6 >> 1) + uVar13 + 1 != uVar16) {
                  uVar13 = (iVar6 >> 1) + uVar13;
                  do {
                    uVar17 = (int)(uVar13 + uVar16) >> 1;
                    if (puVar3[(int)uVar17] == uVar9) break;
                    uVar4 = uVar17;
                    if (uVar9 <= puVar3[(int)uVar17]) {
                      uVar4 = uVar13;
                      uVar16 = uVar17;
                    }
                    uVar13 = uVar4;
                    uVar17 = uVar16;
                  } while (uVar13 + 1 != uVar16);
                }
              }
            }
          }
          else {
            dst->array[iVar7] = uVar15;
            iVar7 = iVar7 + 1;
            uVar17 = uVar16 + 1;
          }
          uVar16 = uVar17;
        } while ((int)uVar16 < iVar1);
      }
LAB_00114aff:
      dst->cardinality = iVar7;
    }
  }
  return;
}

Assistant:

void array_run_container_intersection(const array_container_t *src_1,
                                      const run_container_t *src_2,
                                      array_container_t *dst) {
    if (run_container_is_full(src_2)) {
        if (dst != src_1) array_container_copy(src_1, dst);
        return;
    }
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    if (src_2->n_runs == 0) {
        return;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                dst->cardinality = newcard;
                return;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            dst->array[newcard] = arrayval;
            newcard++;
            arraypos++;
        }
    }
    dst->cardinality = newcard;
}